

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objfile.c
# Opt level: O3

void read_obj_header(void)

{
  int iVar1;
  long local_1c;
  
  read_data((uchar *)&local_1c,8);
  iVar1 = read_int32();
  if (local_1c != 0x5443454a424f4247) {
    err(F,"invalid object file");
  }
  if (iVar1 == 1) {
    return;
  }
  err(F,"object file format version not handled");
  return;
}

Assistant:

void read_obj_header()
{
    obj_header_t header;
    read_data((unsigned char*)header.signature, 8);
    header.version = read_int32();
    if (strncmp((char*)header.signature, "GBOBJECT", 8) != 0)
        err(F, "invalid object file");
    if (header.version != 1)
        err(F, "object file format version not handled");
}